

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O0

IO * __thiscall OpenMesh::IO::get_property_name(IO *this,string *_string1,string *_string2)

{
  bool bVar1;
  ostream *this_00;
  allocator local_21;
  string *local_20;
  string *_string2_local;
  string *_string1_local;
  
  local_20 = _string2;
  _string2_local = _string1;
  _string1_local = (string *)this;
  bVar1 = std::operator==(_string1,"float32");
  if ((((((!bVar1) && (bVar1 = std::operator==(_string1,"float64"), !bVar1)) &&
        (bVar1 = std::operator==(_string1,"float"), !bVar1)) &&
       (((bVar1 = std::operator==(_string1,"double"), !bVar1 &&
         (bVar1 = std::operator==(_string1,"int8"), !bVar1)) &&
        ((bVar1 = std::operator==(_string1,"uint8"), !bVar1 &&
         ((bVar1 = std::operator==(_string1,"char"), !bVar1 &&
          (bVar1 = std::operator==(_string1,"uchar"), !bVar1)))))))) &&
      ((bVar1 = std::operator==(_string1,"int32"), !bVar1 &&
       (((bVar1 = std::operator==(_string1,"uint32"), !bVar1 &&
         (bVar1 = std::operator==(_string1,"int"), !bVar1)) &&
        (bVar1 = std::operator==(_string1,"uint"), !bVar1)))))) &&
     (((bVar1 = std::operator==(_string1,"int16"), !bVar1 &&
       (bVar1 = std::operator==(_string1,"uint16"), !bVar1)) &&
      ((bVar1 = std::operator==(_string1,"short"), !bVar1 &&
       (bVar1 = std::operator==(_string1,"ushort"), !bVar1)))))) {
    bVar1 = std::operator==(_string2,"float32");
    if ((((!bVar1) && (bVar1 = std::operator==(_string2,"float64"), !bVar1)) &&
        (bVar1 = std::operator==(_string2,"float"), !bVar1)) &&
       (((((bVar1 = std::operator==(_string2,"double"), !bVar1 &&
           (bVar1 = std::operator==(_string2,"int8"), !bVar1)) &&
          (bVar1 = std::operator==(_string2,"uint8"), !bVar1)) &&
         ((bVar1 = std::operator==(_string2,"char"), !bVar1 &&
          (bVar1 = std::operator==(_string2,"uchar"), !bVar1)))) &&
        ((((bVar1 = std::operator==(_string2,"int32"), !bVar1 &&
           ((bVar1 = std::operator==(_string2,"uint32"), !bVar1 &&
            (bVar1 = std::operator==(_string2,"int"), !bVar1)))) &&
          (bVar1 = std::operator==(_string2,"uint"), !bVar1)) &&
         ((((bVar1 = std::operator==(_string2,"int16"), !bVar1 &&
            (bVar1 = std::operator==(_string2,"uint16"), !bVar1)) &&
           (bVar1 = std::operator==(_string2,"short"), !bVar1)) &&
          (bVar1 = std::operator==(_string2,"ushort"), !bVar1)))))))) {
      this_00 = std::operator<<((ostream *)&std::cerr,"Unsupported entry type");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"Unsupported",&local_21);
      std::allocator<char>::~allocator((allocator<char> *)&local_21);
      return this;
    }
    std::__cxx11::string::string((string *)this,(string *)_string1);
    return this;
  }
  std::__cxx11::string::string((string *)this,(string *)_string2);
  return this;
}

Assistant:

std::string get_property_name(std::string _string1, std::string _string2) {

    if (_string1 == "float32" || _string1 == "float64" || _string1 == "float" || _string1 == "double" ||
        _string1 == "int8" || _string1 == "uint8" || _string1 == "char" || _string1 == "uchar" ||
        _string1 == "int32" || _string1 == "uint32" || _string1 == "int" || _string1 == "uint" ||
        _string1 == "int16" || _string1 == "uint16" || _string1 == "short" || _string1 == "ushort")
        return _string2;

    if (_string2 == "float32" || _string2 == "float64" || _string2 == "float" || _string2 == "double" ||
        _string2 == "int8" || _string2 == "uint8" || _string2 == "char" || _string2 == "uchar" ||
        _string2 == "int32" || _string2 == "uint32" || _string2 == "int" || _string2 == "uint" ||
        _string2 == "int16" || _string2 == "uint16" || _string2 == "short" || _string2 == "ushort")
        return _string1;


    std::cerr << "Unsupported entry type" << std::endl;
    return "Unsupported";
}